

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O1

bool __thiscall ON_FunctionList::EmptyList(ON_FunctionList *this)

{
  bool bVar1;
  
  bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
  if (bVar1) {
    this->m_head = (void *)0x0;
    this->m_tail = (void *)0x0;
    ON_FixedSizePool::ReturnAll(&this->m_fsp);
    ON_Lock::ReturnDefaultLock(&this->m_lock);
  }
  return bVar1;
}

Assistant:

bool ON_FunctionList::EmptyList()
{
  if ( false == m_lock.GetDefaultLock() )
    return false;

  m_head = 0;
  m_tail = 0;
  m_fsp.ReturnAll();

  m_lock.ReturnDefaultLock();

  return true;
}